

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_add_passphrase.c
# Opt level: O3

int archive_read_set_passphrase_callback
              (archive *_a,void *client_data,archive_passphrase_callback *cb)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_set_passphrase_callback");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    _a[0xf].read_data_offset = (int64_t)cb;
    _a[0xf].read_data_output_offset = (int64_t)client_data;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
archive_read_set_passphrase_callback(struct archive *_a, void *client_data,
    archive_passphrase_callback *cb)
{
	struct archive_read *a = (struct archive_read *)_a;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
		"archive_read_set_passphrase_callback");

	a->passphrases.callback = cb;
	a->passphrases.client_data = client_data;
	return (ARCHIVE_OK);
}